

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.h
# Opt level: O2

RelativeWorldCoordinates * __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::operator=
          (RelativeWorldCoordinates *this,RelativeWorldCoordinates *param_1)

{
  DataTypeBase local_80;
  short local_78;
  KFIXED<short,_(unsigned_char)__x03_> local_70;
  DataTypeBase local_60;
  short local_58;
  KFIXED<short,_(unsigned_char)__x03_> local_50;
  DataTypeBase local_40;
  short local_38;
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  
  this->m_ui16RefPnt = param_1->m_ui16RefPnt;
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215b90;
  local_38 = (param_1->m_DelX).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_30,&this->m_DelX);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215b90;
  local_58 = (param_1->m_DelY).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_50,&this->m_DelY);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60);
  local_80._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215b90;
  local_78 = (param_1->m_DelZ).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_70,&this->m_DelZ);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_80);
  return this;
}

Assistant:

class KDIS_EXPORT RelativeWorldCoordinates: public DataTypeBase
{
protected:

    KUINT16 m_ui16RefPnt;

    KFIXED16_3 m_DelX;

    KFIXED16_3 m_DelY;

    KFIXED16_3 m_DelZ;

public:

    static const KUINT16 RELATVE_WORLD_COORDINATES_SIZE = 8;

    RelativeWorldCoordinates();

    RelativeWorldCoordinates( KUINT16 RefPnt, KFIXED16_3 DelX, KFIXED16_3 DelY, KFIXED16_3 DelZ );

    RelativeWorldCoordinates(KDataStream &stream) noexcept(false);

    virtual ~RelativeWorldCoordinates();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::SetReferencePoint
    //              KDIS::DATA_TYPE::RelativeWorldCoordinates::GetReferencePoint
    // Description: Identifies the number of the reference point against which
    //              e Delta-X, Delta-Y, and Delta-Z distances are calculated.
    // Parameter:   KUINT16 RP
    //************************************
    void SetReferencePoint( KUINT16 RP );
    KUINT16 GetReferencePoint() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::SetDelta
    //              KDIS::DATA_TYPE::RelativeWorldCoordinates::GetDelta
    // Description: The difference between LE�s X, Y and Z direction coordinate and the
    //              X, Y and Z direction coordinate of the reference point.
    // Parameter:   KFIXED16_3
    //************************************
    void SetDeltaX( KFIXED16_3 X );
    KFIXED16_3 GetDeltaX() const;
    void SetDeltaY( KFIXED16_3 Y );
    KFIXED16_3 GetDeltaY() const;
    void SetDeltaZ( KFIXED16_3 X );
    KFIXED16_3 GetDeltaZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const RelativeWorldCoordinates  & Value ) const;
    KBOOL operator != ( const RelativeWorldCoordinates  & Value ) const;
}